

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall
Rml::DataViewText::Initialize
          (DataViewText *this,DataModel *model,Element *element,String *param_3,String *param_4)

{
  bool bVar1;
  ElementText *this_00;
  reference pcVar2;
  undefined8 uVar3;
  pointer this_01;
  allocator<char> local_129;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  string local_f8 [32];
  undefined1 local_d8 [16];
  DataEntry entry;
  char *error_str;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_90;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  String *__range1;
  bool in_string;
  bool in_brackets;
  bool was_in_brackets;
  size_t sStack_70;
  char previous;
  size_t cur;
  size_t begin_brackets;
  DataExpressionInterface expression_interface;
  String *in_text;
  ElementText *element_text;
  String *param_4_local;
  String *param_3_local;
  Element *element_local;
  DataModel *model_local;
  DataViewText *this_local;
  
  this_00 = rmlui_dynamic_cast<Rml::ElementText*,Rml::Element*>(element);
  if (this_00 == (ElementText *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    expression_interface.event = (Event *)ElementText::GetText_abi_cxx11_(this_00);
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::reserve((ulong)&this->text);
    DataExpressionInterface::DataExpressionInterface
              ((DataExpressionInterface *)&begin_brackets,model,element,(Event *)0x0);
    cur = 0;
    sStack_70 = 0;
    __range1._7_1_ = '\0';
    __range1._6_1_ = 0;
    __range1._5_1_ = 0;
    __range1._4_1_ = 0;
    __end1._M_current = (char *)::std::__cxx11::string::begin();
    _Stack_90._M_current = (char *)::std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff70);
      if (!bVar1) break;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      error_str._7_1_ = *pcVar2;
      __range1._6_1_ = __range1._5_1_ & 1;
      entry.value.field_2._8_8_ =
           XMLParseTools::ParseDataBrackets
                     ((bool *)((long)&__range1 + 5),(bool *)((long)&__range1 + 4),error_str._7_1_,
                      __range1._7_1_);
      if ((char *)entry.value.field_2._8_8_ != (char *)0x0) {
        uVar3 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Failed to parse data view text \'%s\'. %s",uVar3,
                     entry.value.field_2._8_8_);
        return false;
      }
      if (((__range1._6_1_ & 1) == 0) && ((__range1._5_1_ & 1) != 0)) {
        cur = sStack_70;
      }
      else if (((__range1._6_1_ & 1) == 0) || ((__range1._5_1_ & 1) != 0)) {
        if (((__range1._5_1_ & 1) == 0) && (__range1._7_1_ != '\0')) {
          ::std::__cxx11::string::push_back((char)this + '\x18');
        }
      }
      else {
        DataEntry::DataEntry((DataEntry *)(local_d8 + 8));
        local_d8._8_8_ = ::std::__cxx11::string::size();
        local_110._M_current = (char *)::std::__cxx11::string::begin();
        local_108 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_110,cur);
        local_100 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_108,1);
        local_128._M_current = (char *)::std::__cxx11::string::begin();
        local_120 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_128,sStack_70);
        local_118 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator-(&local_120,1);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  (local_f8,local_100,local_118,&local_129);
        MakeUnique<Rml::DataExpression,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::operator=
                  ((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
                   &entry,(unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                           *)local_d8);
        ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::
        ~unique_ptr((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
                    local_d8);
        ::std::__cxx11::string::~string(local_f8);
        ::std::allocator<char>::~allocator(&local_129);
        ::std::__cxx11::string::operator=((string *)&entry.data_expression,"#rmlui#");
        this_01 = ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                  ::operator->((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                                *)&entry);
        bVar1 = DataExpression::Parse(this_01,(DataExpressionInterface *)&begin_brackets,false);
        if (bVar1) {
          ::std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
          ::push_back(&this->data_entries,(value_type *)(local_d8 + 8));
        }
        error_str._7_1_ = '\0';
        DataEntry::~DataEntry((DataEntry *)(local_d8 + 8));
      }
      sStack_70 = sStack_70 + 1;
      __range1._7_1_ = error_str._7_1_;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    if (((__range1._5_1_ & 1) == 0) && (__range1._7_1_ != '\0')) {
      ::std::__cxx11::string::push_back((char)this + '\x18');
    }
    bVar1 = ::std::
            vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>::
            empty(&this->data_entries);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DataViewText::Initialize(DataModel& model, Element* element, const String& /*expression*/, const String& /*modifier*/)
{
	ElementText* element_text = rmlui_dynamic_cast<ElementText*>(element);
	if (!element_text)
		return false;

	const String& in_text = element_text->GetText();

	text.reserve(in_text.size());

	DataExpressionInterface expression_interface(&model, element);

	size_t begin_brackets = 0;
	size_t cur = 0;
	char previous = 0;
	bool was_in_brackets = false;
	bool in_brackets = false;
	bool in_string = false;

	for (char c : in_text)
	{
		was_in_brackets = in_brackets;

		const char* error_str = XMLParseTools::ParseDataBrackets(in_brackets, in_string, c, previous);
		if (error_str)
		{
			Log::Message(Log::LT_WARNING, "Failed to parse data view text '%s'. %s", in_text.c_str(), error_str);
			return false;
		}

		if (!was_in_brackets && in_brackets)
		{
			begin_brackets = cur;
		}
		else if (was_in_brackets && !in_brackets)
		{
			DataEntry entry;
			entry.index = text.size();
			entry.data_expression = MakeUnique<DataExpression>(String(in_text.begin() + begin_brackets + 1, in_text.begin() + cur - 1));
			entry.value = "#rmlui#"; // A random value that the user string will not be initialized with.

			if (entry.data_expression->Parse(expression_interface, false))
				data_entries.push_back(std::move(entry));

			// Reset char so that it won't be appended to the output
			c = 0;
		}
		else if (!in_brackets && previous)
		{
			text.push_back(previous);
		}

		cur++;
		previous = c;
	}

	if (!in_brackets && previous)
	{
		text.push_back(previous);
	}

	if (data_entries.empty())
		return false;

	return true;
}